

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCGeometryCollider.cpp
# Opt level: O3

int __thiscall
chrono::collision::BoxBoxCollisionTest2::RectQuadEdgeIntersectionTest::operator()
          (RectQuadEdgeIntersectionTest *this,double *envelope,double *rect,double *quad,
          bool *inside,double *ret)

{
  double dVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  double *r;
  double *pdVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  double qyt_1;
  double qyt;
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double qxt_1;
  double dVar18;
  double qxt;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  
  lVar5 = 1;
  lVar4 = 0;
  iVar3 = 0;
  do {
    pdVar6 = (double *)((long)quad + lVar4 + 0x10);
    dVar14 = pdVar6[-2];
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar14;
    dVar10 = pdVar6[-1];
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar10;
    if (lVar4 == 0x30) {
      pdVar6 = quad;
    }
    dVar12 = *pdVar6;
    dVar1 = pdVar6[1];
    if ((inside[lVar5 + -1] != true) || (inside[(uint)lVar5 & 3] == false)) {
      dVar15 = dVar12 - dVar14;
      dVar2 = dVar1 - dVar10;
      if ((dVar15 != 0.0) || (NAN(dVar15))) {
        dVar18 = *rect;
        auVar16._0_8_ = dVar2 / dVar15;
        auVar16._8_8_ = 0;
        dVar19 = -dVar18;
        if (((dVar14 < dVar19) && (dVar19 < dVar12)) || ((dVar19 < dVar14 && (dVar12 < dVar19)))) {
          auVar21._8_8_ = 0;
          auVar21._0_8_ = dVar19 - dVar14;
          auVar21 = vfmadd213sd_fma(auVar21,auVar16,auVar8);
          dVar20 = auVar21._0_8_;
          if ((-rect[1] < dVar20) && (dVar20 < rect[1])) {
            *ret = dVar19;
            ret[1] = dVar20;
            ret = ret + 2;
            iVar3 = iVar3 + 1;
            dVar18 = *rect;
          }
        }
        if (((dVar14 < dVar18) && (dVar18 < dVar12)) || ((dVar18 < dVar14 && (dVar12 < dVar18)))) {
          auVar13._8_8_ = 0;
          auVar13._0_8_ = dVar18 - dVar14;
          auVar8 = vfmadd213sd_fma(auVar16,auVar13,auVar8);
          dVar14 = auVar8._0_8_;
          if ((-rect[1] < dVar14) && (dVar14 < rect[1])) {
            *ret = dVar18;
            ret[1] = dVar14;
            ret = ret + 2;
            iVar3 = iVar3 + 1;
          }
        }
      }
      if ((dVar2 != 0.0) || (NAN(dVar2))) {
        auVar11._0_8_ = dVar15 / dVar2;
        auVar11._8_8_ = 0;
        dVar14 = rect[1];
        dVar12 = -dVar14;
        if (((dVar10 < dVar12) && (dVar12 < dVar1)) || ((dVar12 < dVar10 && (dVar1 < dVar12)))) {
          auVar17._8_8_ = 0;
          auVar17._0_8_ = dVar12 - dVar10;
          auVar8 = vfmadd213sd_fma(auVar17,auVar11,auVar7);
          dVar15 = auVar8._0_8_;
          if ((-*rect < dVar15) && (dVar15 < *rect)) {
            *ret = dVar15;
            ret[1] = dVar12;
            ret = ret + 2;
            iVar3 = iVar3 + 1;
            dVar14 = rect[1];
          }
        }
        if (((dVar10 < dVar14) && (dVar14 < dVar1)) || ((dVar14 < dVar10 && (dVar1 < dVar14)))) {
          auVar9._8_8_ = 0;
          auVar9._0_8_ = dVar14 - dVar10;
          auVar7 = vfmadd213sd_fma(auVar11,auVar9,auVar7);
          dVar10 = auVar7._0_8_;
          if ((-*rect < dVar10) && (dVar10 < *rect)) {
            *ret = dVar10;
            ret[1] = dVar14;
            ret = ret + 2;
            iVar3 = iVar3 + 1;
          }
        }
      }
    }
    lVar4 = lVar4 + 0x10;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  return iVar3;
}

Assistant:

int operator()(double const& envelope, double* rect, double* quad, bool* inside, double* ret) {
            int cnt = 0;
            double* r = ret;
            {
                //--- Test the four edges of the quad for crossing the edges of the rect.
                double qx0, qy0, qx1, qy1, tst;
                double* q = quad;
                for (int i = 0; i < 4; ++i) {
                    qx0 = *q;
                    ++q;
                    qy0 = *q;
                    ++q;
                    double* nextq = (i == 3) ? quad : q;
                    qx1 = *nextq;
                    ++nextq;
                    qy1 = *nextq;
                    bool inside0 = inside[i];
                    bool inside1 = inside[(i + 1) % 4];
                    if (inside0 && inside1)
                        continue;
                    double dx = (qx1 - qx0);
                    double dy = (qy1 - qy0);
                    if (dx) {
                        double alpha = dy / dx;
                        tst = -rect[0];  //--- left side
                        if (((qx0 < tst) && (qx1 > tst)) || ((qx0 > tst) && (qx1 < tst))) {
                            double qxt = -rect[0];
                            double qyt = qy0 + (qxt - qx0) * alpha;
                            if ((-rect[1] < qyt) && (qyt < rect[1])) {
                                *r = qxt;
                                ++r;
                                *r = qyt;
                                ++r;
                                ++cnt;
                            }
                        }
                        tst = rect[0];
                        if (((qx0 < tst) && (qx1 > tst)) || ((qx0 > tst) && (qx1 < tst))) {
                            double qxt = rect[0];
                            double qyt = qy0 + (qxt - qx0) * alpha;
                            if ((-rect[1] < qyt) && (qyt < rect[1])) {
                                *r = qxt;
                                ++r;
                                *r = qyt;
                                ++r;
                                ++cnt;
                            }
                        }
                    }
                    if (dy) {
                        double inv_alpha = dx / dy;
                        tst = -rect[1];  //--- bottom side
                        if (((qy0 < tst) && (qy1 > tst)) || ((qy0 > tst) && (qy1 < tst))) {
                            double qyt = -rect[1];
                            double qxt = qx0 + (qyt - qy0) * inv_alpha;
                            if ((-rect[0] < qxt) && (qxt < rect[0])) {
                                *r = qxt;
                                ++r;
                                *r = qyt;
                                ++r;
                                ++cnt;
                            }
                        }
                        tst = rect[1];  //--- top side
                        if (((qy0 < tst) && (qy1 > tst)) || ((qy0 > tst) && (qy1 < tst))) {
                            double qyt = rect[1];
                            double qxt = qx0 + (qyt - qy0) * inv_alpha;
                            if ((-rect[0] < qxt) && (qxt < rect[0])) {
                                *r = qxt;
                                ++r;
                                *r = qyt;
                                ++r;
                                ++cnt;
                            }
                        }
                    }
                }
            }
            return cnt;
        }